

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.cc
# Opt level: O0

void __thiscall fasttext::QMatrix::addToVector(QMatrix *this,Vector *x,int32_t t)

{
  pointer this_00;
  int in_EDX;
  long in_RDI;
  uint8_t *unaff_retaddr;
  Vector *in_stack_00000008;
  ProductQuantizer *in_stack_00000010;
  real norm;
  undefined8 in_stack_ffffffffffffffd0;
  long lVar1;
  
  lVar1 = in_RDI;
  if ((*(byte *)(in_RDI + 0x40) & 1) != 0) {
    this_00 = std::
              unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
              ::operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                            *)0x18262e);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x28),(long)in_EDX
              );
    ProductQuantizer::get_centroids
              (this_00,(int32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
               (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x18));
  }
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  operator->((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
              *)0x182669);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x182685);
  ProductQuantizer::addcode
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(int32_t)((ulong)lVar1 >> 0x20),
             (real)lVar1);
  return;
}

Assistant:

void QMatrix::addToVector(Vector& x, int32_t t) const {
  real norm = 1;
  if (qnorm_) {
    norm = npq_->get_centroids(0, norm_codes_[t])[0];
  }
  pq_->addcode(x, codes_.data(), t, norm);
}